

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GofAngle2.cpp
# Opt level: O2

void __thiscall
OpenMD::GofAngle2::collectHistogram(GofAngle2 *this,StuntDouble *sd1,StuntDouble *sd2)

{
  int *piVar1;
  char cVar2;
  bool bVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  MultipoleAdapter ma2;
  MultipoleAdapter ma1;
  Vector3d dipole2;
  Vector3d dipole1;
  Vector3d r12;
  Vector3d pos2;
  Vector3d pos1;
  MultipoleAdapter local_160;
  MultipoleAdapter local_158;
  Vector<double,_3U> local_150;
  Vector<double,_3U> local_138;
  Vector<double,_3U> local_120;
  RectMatrix<double,_3U,_3U> local_108;
  Vector<double,_3U> local_c0;
  Vector<double,_3U> local_a8;
  Vector<double,_3U> local_90;
  RotMat3x3d local_78;
  
  if (sd1 != sd2) {
    cVar2 = (((this->super_RadialDistrFunc).super_StaticAnalyser.info_)->simParams_->
            UsePeriodicBoundaryConditions).super_ParameterBase.field_0x2b;
    StuntDouble::getPos((Vector3d *)&local_90,sd1);
    StuntDouble::getPos((Vector3d *)&local_a8,sd2);
    operator-((Vector<double,_3U> *)&local_108,&local_90,&local_a8);
    Vector<double,_3U>::Vector(&local_c0,(Vector<double,_3U> *)&local_108);
    if (cVar2 == '\x01') {
      Snapshot::wrapVector((this->super_RadialDistrFunc).currentSnapshot_,(Vector3d *)&local_c0);
    }
    local_158.at_ = (AtomType *)sd1[1]._vptr_StuntDouble;
    local_160.at_ = (AtomType *)sd2[1]._vptr_StuntDouble;
    if (1 < sd1->objType_ - otDAtom) {
      (*sd1->_vptr_StuntDouble[7])((string *)&local_108,sd1);
      snprintf(painCave.errMsg,2000,"GofAngle2: attempted to use a non-directional object: %s\n",
               local_108.data_[0][0]);
      std::__cxx11::string::~string((string *)&local_108);
      painCave.isFatal = 1;
      simError();
    }
    if (1 < sd2->objType_ - otDAtom) {
      (*sd2->_vptr_StuntDouble[7])((string *)&local_108,sd2);
      snprintf(painCave.errMsg,2000,"GofAngle2: attempted to use a non-directional object: %s\n",
               local_108.data_[0][0]);
      std::__cxx11::string::~string((string *)&local_108);
      painCave.isFatal = 1;
      simError();
    }
    Vector<double,_3U>::Vector(&local_120);
    Vector<double,_3U>::Vector(&local_138);
    bVar3 = MultipoleAdapter::isDipole(&local_158);
    if (bVar3) {
      StuntDouble::getDipole((Vector3d *)&local_108,sd1);
      Vector<double,_3U>::operator=(&local_120,(Vector<double,_3U> *)&local_108);
    }
    else {
      StuntDouble::getA(&local_78,sd1);
      SquareMatrix3<double>::transpose((SquareMatrix3<double> *)&local_108,&local_78);
      operator*(&local_150,&local_108,(Vector<double,_3U> *)OpenMD::V3Z);
      Vector3<double>::operator=((Vector3<double> *)&local_120,&local_150);
    }
    bVar3 = MultipoleAdapter::isDipole(&local_160);
    if (bVar3) {
      StuntDouble::getDipole((Vector3d *)&local_108,sd2);
      Vector<double,_3U>::operator=(&local_138,(Vector<double,_3U> *)&local_108);
    }
    else {
      StuntDouble::getA(&local_78,sd2);
      SquareMatrix3<double>::transpose((SquareMatrix3<double> *)&local_108,&local_78);
      operator*(&local_150,&local_108,(Vector<double,_3U> *)OpenMD::V3Z);
      Vector3<double>::operator=((Vector3<double> *)&local_138,&local_150);
    }
    Vector<double,_3U>::normalize(&local_c0);
    Vector<double,_3U>::normalize(&local_120);
    Vector<double,_3U>::normalize(&local_138);
    dVar4 = dot<double,3u>(&local_c0,&local_120);
    dVar5 = dot<double,3u>(&local_120,&local_138);
    dVar6 = (double)((this->super_RadialDistrFunc).super_StaticAnalyser.nBins_ - 1) * 0.5;
    piVar1 = (int *)(*(long *)&(this->histogram_).
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start
                               [(int)((dVar4 + 1.0) * dVar6)].
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data + (long)(int)((dVar5 + 1.0) * dVar6) * 4);
    *piVar1 = *piVar1 + 1;
    this->npairs_ = this->npairs_ + 1;
  }
  return;
}

Assistant:

void GofAngle2::collectHistogram(StuntDouble* sd1, StuntDouble* sd2) {
    bool usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();

    if (sd1 == sd2) { return; }

    Vector3d pos1 = sd1->getPos();
    Vector3d pos2 = sd2->getPos();
    Vector3d r12  = pos1 - pos2;
    if (usePeriodicBoundaryConditions_) currentSnapshot_->wrapVector(r12);

    AtomType* atype1     = static_cast<Atom*>(sd1)->getAtomType();
    AtomType* atype2     = static_cast<Atom*>(sd2)->getAtomType();
    MultipoleAdapter ma1 = MultipoleAdapter(atype1);
    MultipoleAdapter ma2 = MultipoleAdapter(atype2);

    if (!sd1->isDirectional()) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "GofAngle2: attempted to use a non-directional object: %s\n",
               sd1->getType().c_str());
      painCave.isFatal = 1;
      simError();
    }

    if (!sd2->isDirectional()) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "GofAngle2: attempted to use a non-directional object: %s\n",
               sd2->getType().c_str());
      painCave.isFatal = 1;
      simError();
    }

    Vector3d dipole1, dipole2;
    if (ma1.isDipole())
      dipole1 = sd1->getDipole();
    else
      dipole1 = sd1->getA().transpose() * V3Z;

    if (ma2.isDipole())
      dipole2 = sd2->getDipole();
    else
      dipole2 = sd2->getA().transpose() * V3Z;

    r12.normalize();
    dipole1.normalize();
    dipole2.normalize();

    RealType cosAngle1 = dot(r12, dipole1);
    RealType cosAngle2 = dot(dipole1, dipole2);

    RealType halfBin = (nBins_ - 1) * 0.5;
    int angleBin1    = int(halfBin * (cosAngle1 + 1.0));
    int angleBin2    = int(halfBin * (cosAngle2 + 1.0));

    ++histogram_[angleBin1][angleBin2];
    ++npairs_;
  }